

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void relink_timers(boolean ghostly,level *lev)

{
  boolean bVar1;
  obj *poVar2;
  uint local_24;
  timer_element *ptStack_20;
  uint nid;
  timer_element *curr;
  level *lev_local;
  boolean ghostly_local;
  
  ptStack_20 = lev->lev_timers;
  curr = (timer_element *)lev;
  lev_local._7_1_ = ghostly;
  do {
    if (ptStack_20 == (timer_element *)0x0) {
      return;
    }
    if ((ptStack_20->field_0x1b & 1) != 0) {
      if (ptStack_20->kind != 2) {
        panic("relink_timers 2");
      }
      if (lev_local._7_1_ == '\0') {
        local_24 = (uint)ptStack_20->arg;
      }
      else {
        bVar1 = lookup_id_mapping((uint)ptStack_20->arg,&local_24);
        if (bVar1 == '\0') {
          panic("relink_timers 1");
        }
      }
      poVar2 = find_oid((level *)curr,local_24);
      ptStack_20->arg = poVar2;
      if (ptStack_20->arg == (void *)0x0) {
        panic("cant find o_id %d",(ulong)local_24);
      }
      ptStack_20->field_0x1b = ptStack_20->field_0x1b & 0xfe;
    }
    ptStack_20 = ptStack_20->next;
  } while( true );
}

Assistant:

void relink_timers(boolean ghostly, struct level *lev)
{
    timer_element *curr;
    unsigned nid;

    for (curr = lev->lev_timers; curr; curr = curr->next) {
	if (curr->needs_fixup) {
	    if (curr->kind == TIMER_OBJECT) {
		if (ghostly) {
		    if (!lookup_id_mapping((long)curr->arg, &nid))
			panic("relink_timers 1");
		} else
		    nid = (long) curr->arg;
		curr->arg = find_oid(lev, nid);
		if (!curr->arg) panic("cant find o_id %d", nid);
		curr->needs_fixup = 0;
	    } else
		panic("relink_timers 2");
	}
    }
}